

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_addtimeout(curl_llist *timeoutlist,timeval *stamp)

{
  int iVar1;
  timeval *p;
  size_t sVar2;
  long lVar3;
  long diff;
  timeval *checktime;
  curl_llist_element *prev;
  timeval *timedup;
  curl_llist_element *e;
  timeval *stamp_local;
  curl_llist *timeoutlist_local;
  
  checktime = (timeval *)0x0;
  p = (timeval *)(*Curl_cmalloc)(0x10);
  if (p == (timeval *)0x0) {
    timeoutlist_local._4_4_ = CURLM_OUT_OF_MEMORY;
  }
  else {
    p->tv_sec = stamp->tv_sec;
    p->tv_usec = stamp->tv_usec;
    sVar2 = Curl_llist_count(timeoutlist);
    if (sVar2 != 0) {
      timedup = (timeval *)timeoutlist->head;
      while ((timedup != (timeval *)0x0 &&
             (lVar3 = curlx_tvdiff(*(timeval *)timedup->tv_sec,*p), lVar3 < 1))) {
        checktime = timedup;
        timedup = (timeval *)timedup[1].tv_sec;
      }
    }
    iVar1 = Curl_llist_insert_next(timeoutlist,(curl_llist_element *)checktime,p);
    if (iVar1 == 0) {
      (*Curl_cfree)(p);
      timeoutlist_local._4_4_ = CURLM_OUT_OF_MEMORY;
    }
    else {
      timeoutlist_local._4_4_ = CURLM_OK;
    }
  }
  return timeoutlist_local._4_4_;
}

Assistant:

static CURLMcode
multi_addtimeout(struct curl_llist *timeoutlist,
                 struct timeval *stamp)
{
  struct curl_llist_element *e;
  struct timeval *timedup;
  struct curl_llist_element *prev = NULL;

  timedup = malloc(sizeof(*timedup));
  if(!timedup)
    return CURLM_OUT_OF_MEMORY;

  /* copy the timestamp */
  memcpy(timedup, stamp, sizeof(*timedup));

  if(Curl_llist_count(timeoutlist)) {
    /* find the correct spot in the list */
    for(e = timeoutlist->head; e; e = e->next) {
      struct timeval *checktime = e->ptr;
      long diff = curlx_tvdiff(*checktime, *timedup);
      if(diff > 0)
        break;
      prev = e;
    }

  }
  /* else
     this is the first timeout on the list */

  if(!Curl_llist_insert_next(timeoutlist, prev, timedup)) {
    free(timedup);
    return CURLM_OUT_OF_MEMORY;
  }

  return CURLM_OK;
}